

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O2

void randomx_calculate_commitment(void *input,size_t inputSize,void *hash_in,void *com_out)

{
  blake2b_state state;
  
  randomx_blake2b_init(&state,0x20);
  randomx_blake2b_update(&state,input,inputSize);
  randomx_blake2b_update(&state,hash_in,0x20);
  randomx_blake2b_final(&state,com_out,0x20);
  return;
}

Assistant:

void randomx_calculate_commitment(const void* input, size_t inputSize, const void* hash_in, void* com_out) {
		assert(inputSize == 0 || input != nullptr);
		assert(hash_in != nullptr);
		assert(com_out != nullptr);
		blake2b_state state;
		blake2b_init(&state, RANDOMX_HASH_SIZE);
		blake2b_update(&state, input, inputSize);
		blake2b_update(&state, hash_in, RANDOMX_HASH_SIZE);
		blake2b_final(&state, com_out, RANDOMX_HASH_SIZE);
	}